

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopOper.c
# Opt level: O1

Hop_Obj_t * Hop_CreateOr(Hop_Man_t *p,int nVars)

{
  Hop_Obj_t *pHVar1;
  Hop_Obj_t *p0;
  int i;
  
  p0 = p->pConst1;
  if (0 < nVars) {
    i = 0;
    do {
      pHVar1 = Hop_IthVar(p,i);
      p0 = Hop_And(p,p0,(Hop_Obj_t *)((ulong)pHVar1 ^ 1));
      i = i + 1;
    } while (nVars != i);
  }
  return (Hop_Obj_t *)((ulong)p0 ^ 1);
}

Assistant:

Hop_Obj_t * Hop_CreateOr( Hop_Man_t * p, int nVars )
{
    Hop_Obj_t * pFunc;
    int i;
    pFunc = Hop_ManConst0( p );
    for ( i = 0; i < nVars; i++ )
        pFunc = Hop_Or( p, pFunc, Hop_IthVar(p, i) );
    return pFunc;
}